

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O0

bool __thiscall InstructionSet::x86::Flags::flag<(InstructionSet::x86::Flag)6>(Flags *this)

{
  Flags *this_local;
  
  return this->direction_ < 0;
}

Assistant:

bool flag() const {
			switch(flag_v) {
				case Flag::Carry:			return carry_;
				case Flag::AuxiliaryCarry:	return auxiliary_carry_;
				case Flag::Sign:			return sign_;
				case Flag::Overflow:		return overflow_;
				case Flag::Trap:			return trap_;
				case Flag::Interrupt:		return interrupt_;
				case Flag::Direction:		return direction_ < 0;
				case Flag::Zero:			return !zero_;
				case Flag::ParityOdd:		return not_parity_bit();
			}
		}